

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReshapeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  int iVar3;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string err;
  ReshapeLayerParams *params;
  string local_88;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar2;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 == 0) {
    local_39 = 0;
    validateOutputCount(__return_storage_ptr__,local_20,1,1);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      local_39 = 1;
    }
    local_38 = (uint)!bVar2;
    if ((local_39 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    pNVar1 = local_20;
    if (local_38 == 0) {
      if ((this->ndArrayInterpretation & 1U) != 0) {
        local_3a = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Reshape",&local_61);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,pNVar1,&local_60,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_3a = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_3a & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        pNVar1 = local_20;
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
        local_62 = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"Reshape",(allocator<char> *)((long)&params + 7));
        validateRankCount(__return_storage_ptr__,pNVar1,&local_88,5,5,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_62 = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_62 & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
      }
      err.field_2._8_8_ = Specification::NeuralNetworkLayer::reshape(local_20);
      iVar3 = Specification::ReshapeLayerParams::targetshape_size
                        ((ReshapeLayerParams *)err.field_2._8_8_);
      if ((iVar3 == 3) ||
         (iVar3 = Specification::ReshapeLayerParams::targetshape_size
                            ((ReshapeLayerParams *)err.field_2._8_8_), iVar3 == 4)) {
        Result::Result(__return_storage_ptr__);
      }
      else {
        __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
        std::operator+(&local_d8,"Reshape layer \'",__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,&local_d8,"\' target shape must be 3D or 4D.");
        std::__cxx11::string::~string((string *)&local_d8);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b8);
        local_38 = 1;
        std::__cxx11::string::~string((string *)local_b8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReshapeLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Reshape", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Reshape", 5, 5, blobNameToRank));
    }

    const auto& params = layer.reshape();
    if (params.targetshape_size() != 3 && params.targetshape_size() != 4) {
        std::string err = "Reshape layer '" + layer.name() + "' target shape must be 3D or 4D.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}